

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool IsBIP30Repeat(CBlockIndex *block_index)

{
  uint256 *puVar1;
  long in_FS_OFFSET;
  bool bVar2;
  uchar uVar3;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  undefined1 auVar4 [16];
  uchar uVar20;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  undefined1 auVar21 [16];
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  undefined8 local_38;
  undefined2 uStack_30;
  uchar uStack_2e;
  
  if (block_index->nHeight == 0x166e8) {
    puVar1 = block_index->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
LAB_003f4181:
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    uVar3 = (puVar1->super_base_blob<256U>).m_data._M_elems[0];
    uVar5 = (puVar1->super_base_blob<256U>).m_data._M_elems[1];
    uVar6 = (puVar1->super_base_blob<256U>).m_data._M_elems[2];
    uVar7 = (puVar1->super_base_blob<256U>).m_data._M_elems[3];
    uVar8 = (puVar1->super_base_blob<256U>).m_data._M_elems[4];
    uVar9 = (puVar1->super_base_blob<256U>).m_data._M_elems[5];
    uVar10 = (puVar1->super_base_blob<256U>).m_data._M_elems[6];
    uVar11 = (puVar1->super_base_blob<256U>).m_data._M_elems[7];
    uVar12 = (puVar1->super_base_blob<256U>).m_data._M_elems[8];
    uVar13 = (puVar1->super_base_blob<256U>).m_data._M_elems[9];
    uVar14 = (puVar1->super_base_blob<256U>).m_data._M_elems[10];
    uVar15 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xb];
    uVar16 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xc];
    uVar17 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xd];
    uVar18 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xe];
    uVar19 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xf];
    uVar20 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x10];
    uVar22 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x11];
    uVar23 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x12];
    uVar24 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x13];
    uVar25 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x14];
    uVar26 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x15];
    uVar27 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x16];
    uVar28 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x17];
    uVar29 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x18];
    uVar30 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x19];
    uVar31 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1a];
    uVar32 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1b];
    uVar33 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1c];
    uVar34 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1d];
    uVar35 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1e];
    uVar36 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1f];
    uVar37 = '!';
    uVar38 = 0xd7;
    uVar39 = '|';
    uVar40 = 0xcb;
    uVar41 = 'L';
    uVar42 = '\b';
    uVar43 = '8';
    uVar44 = 'j';
    uVar45 = '\x04';
    uVar46 = 0xac;
    uVar47 = '\x01';
    uVar48 = 0x96;
    uVar49 = 0xae;
    uVar50 = '\x10';
    uVar51 = 0xf6;
    uVar52 = 0xa1;
    local_38 = 0x90a18c5577a3c2d2;
    uStack_30 = 0x43f1;
    uStack_2e = '\a';
  }
  else {
    if (block_index->nHeight != 0x166c2) {
      bVar2 = false;
      goto LAB_003f4167;
    }
    puVar1 = block_index->phashBlock;
    if (puVar1 == (uint256 *)0x0) goto LAB_003f4181;
    uVar3 = (puVar1->super_base_blob<256U>).m_data._M_elems[0];
    uVar5 = (puVar1->super_base_blob<256U>).m_data._M_elems[1];
    uVar6 = (puVar1->super_base_blob<256U>).m_data._M_elems[2];
    uVar7 = (puVar1->super_base_blob<256U>).m_data._M_elems[3];
    uVar8 = (puVar1->super_base_blob<256U>).m_data._M_elems[4];
    uVar9 = (puVar1->super_base_blob<256U>).m_data._M_elems[5];
    uVar10 = (puVar1->super_base_blob<256U>).m_data._M_elems[6];
    uVar11 = (puVar1->super_base_blob<256U>).m_data._M_elems[7];
    uVar12 = (puVar1->super_base_blob<256U>).m_data._M_elems[8];
    uVar13 = (puVar1->super_base_blob<256U>).m_data._M_elems[9];
    uVar14 = (puVar1->super_base_blob<256U>).m_data._M_elems[10];
    uVar15 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xb];
    uVar16 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xc];
    uVar17 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xd];
    uVar18 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xe];
    uVar19 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xf];
    uVar20 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x10];
    uVar22 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x11];
    uVar23 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x12];
    uVar24 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x13];
    uVar25 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x14];
    uVar26 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x15];
    uVar27 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x16];
    uVar28 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x17];
    uVar29 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x18];
    uVar30 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x19];
    uVar31 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1a];
    uVar32 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1b];
    uVar33 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1c];
    uVar34 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1d];
    uVar35 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1e];
    uVar36 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1f];
    uVar37 = 0xec;
    uVar38 = 0xca;
    uVar39 = 0xe0;
    uVar40 = '\0';
    uVar41 = 0xe3;
    uVar42 = 200;
    uVar43 = 0xe4;
    uVar44 = 0xe0;
    uVar45 = 0x93;
    uVar46 = 0x93;
    uVar47 = 'c';
    uVar48 = '`';
    uVar49 = 'C';
    uVar50 = '\x1f';
    uVar51 = ';';
    uVar52 = 'v';
    local_38 = 0x398161ffc163c503;
    uStack_30 = 0x4d0a;
    uStack_2e = '\n';
  }
  auVar4[0] = -(uVar3 == uVar37);
  auVar4[1] = -(uVar5 == uVar38);
  auVar4[2] = -(uVar6 == uVar39);
  auVar4[3] = -(uVar7 == uVar40);
  auVar4[4] = -(uVar8 == uVar41);
  auVar4[5] = -(uVar9 == uVar42);
  auVar4[6] = -(uVar10 == uVar43);
  auVar4[7] = -(uVar11 == uVar44);
  auVar4[8] = -(uVar12 == uVar45);
  auVar4[9] = -(uVar13 == uVar46);
  auVar4[10] = -(uVar14 == uVar47);
  auVar4[0xb] = -(uVar15 == uVar48);
  auVar4[0xc] = -(uVar16 == uVar49);
  auVar4[0xd] = -(uVar17 == uVar50);
  auVar4[0xe] = -(uVar18 == uVar51);
  auVar4[0xf] = -(uVar19 == uVar52);
  auVar21[0] = -(uVar20 == (uchar)local_38);
  auVar21[1] = -(uVar22 == local_38._1_1_);
  auVar21[2] = -(uVar23 == local_38._2_1_);
  auVar21[3] = -(uVar24 == local_38._3_1_);
  auVar21[4] = -(uVar25 == local_38._4_1_);
  auVar21[5] = -(uVar26 == local_38._5_1_);
  auVar21[6] = -(uVar27 == local_38._6_1_);
  auVar21[7] = -(uVar28 == local_38._7_1_);
  auVar21[8] = -(uVar29 == (uchar)uStack_30);
  auVar21[9] = -(uVar30 == uStack_30._1_1_);
  auVar21[10] = -(uVar31 == uStack_2e);
  auVar21[0xb] = -(uVar32 == '\0');
  auVar21[0xc] = -(uVar33 == '\0');
  auVar21[0xd] = -(uVar34 == '\0');
  auVar21[0xe] = -(uVar35 == '\0');
  auVar21[0xf] = -(uVar36 == '\0');
  auVar21 = auVar21 & auVar4;
  bVar2 = (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff;
LAB_003f4167:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBIP30Repeat(const CBlockIndex& block_index)
{
    return (block_index.nHeight==91842 && block_index.GetBlockHash() == uint256{"00000000000a4d0a398161ffc163c503763b1f4360639393e0e4c8e300e0caec"}) ||
           (block_index.nHeight==91880 && block_index.GetBlockHash() == uint256{"00000000000743f190a18c5577a3c2d2a1f610ae9601ac046a38084ccb7cd721"});
}